

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldTest_CopyConstruct_Test::
RepeatedPtrFieldTest_CopyConstruct_Test(RepeatedPtrFieldTest_CopyConstruct_Test *this)

{
  RepeatedPtrFieldTest_CopyConstruct_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__RepeatedPtrFieldTest_CopyConstruct_Test_029ea648;
  return;
}

Assistant:

TEST(RepeatedPtrFieldTest, CopyConstruct) {
  auto token = internal::InternalVisibilityForTesting{};
  RepeatedPtrField<std::string> source;
  source.Add()->assign("1");
  source.Add()->assign("2");

  RepeatedPtrField<std::string> destination1(source);
  ASSERT_EQ(2, destination1.size());
  EXPECT_EQ("1", destination1.Get(0));
  EXPECT_EQ("2", destination1.Get(1));

  RepeatedPtrField<std::string> destination2(token, nullptr, source);
  ASSERT_EQ(2, destination2.size());
  EXPECT_EQ("1", destination2.Get(0));
  EXPECT_EQ("2", destination2.Get(1));
}